

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O2

bool read_landmark_data(string *filename,
                       vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations)

{
  uint uVar1;
  istream *piVar2;
  double local_y;
  double local_x;
  LandmarkObs meas;
  string line_obs;
  ifstream in_file_obs;
  uint auStack_398 [122];
  istringstream iss_obs;
  
  std::ifstream::ifstream(&in_file_obs,(filename->_M_dataplus)._M_p,_S_in);
  uVar1 = *(uint *)((long)auStack_398 + *(long *)(_in_file_obs + -0x18));
  if ((uVar1 & 5) == 0) {
    line_obs._M_dataplus._M_p = (pointer)&line_obs.field_2;
    line_obs._M_string_length = 0;
    line_obs.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&in_file_obs,(string *)&line_obs);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&iss_obs,(string *)&line_obs,_S_in);
      std::istream::_M_extract<double>((double *)&iss_obs);
      std::istream::_M_extract<double>((double *)&iss_obs);
      std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back(observations,&meas);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss_obs);
    }
    std::__cxx11::string::~string((string *)&line_obs);
  }
  std::ifstream::~ifstream(&in_file_obs);
  return (uVar1 & 5) == 0;
}

Assistant:

inline bool read_landmark_data(const std::string& filename, std::vector<LandmarkObs>& observations) {

	// Get file of landmark measurements:
	std::ifstream in_file_obs(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_obs) {
		return false;
	}

	// Declare single line of landmark measurement file:
	std::string line_obs;

	// Run over each single line:
	while(getline(in_file_obs, line_obs)){

		std::istringstream iss_obs(line_obs);

		// Declare position values:
		double local_x, local_y;

		//read data from line to values:
		iss_obs >> local_x;
		iss_obs >> local_y;

		// Declare single landmark measurement:
		LandmarkObs meas;

		// Set values
		meas.x = local_x;
		meas.y = local_y;

		// Add to list of control measurements:
		observations.push_back(meas);
	}
	return true;
}